

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZInstPrinter.c
# Opt level: O0

void printU4ImmOperand(MCInst *MI,int OpNum,SStream *O)

{
  cs_detail *pcVar1;
  MCOperand *op;
  int64_t iVar2;
  uint8_t *puVar3;
  int64_t Value;
  SStream *O_local;
  int OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  iVar2 = MCOperand_getImm(op);
  if (iVar2 < 0) {
    if (iVar2 < -9) {
      SStream_concat(O,"-0x%lx",-iVar2);
    }
    else {
      SStream_concat(O,"-%lu",-iVar2);
    }
  }
  else if (iVar2 < 10) {
    SStream_concat(O,"%lu",iVar2);
  }
  else {
    SStream_concat(O,"0x%lx",iVar2);
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar3 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x16;
    puVar3[0] = '\x02';
    puVar3[1] = '\0';
    puVar3[2] = '\0';
    puVar3[3] = '\0';
    *(int64_t *)
     (MI->flat_insn->detail->groups +
     (ulong)(MI->flat_insn->detail->field_6).x86.opcode[0] * 0x20 + 0x1e) = iVar2;
    pcVar1 = MI->flat_insn->detail;
    (pcVar1->field_6).x86.opcode[0] = (pcVar1->field_6).x86.opcode[0] + '\x01';
  }
  return;
}

Assistant:

static void printU4ImmOperand(MCInst *MI, int OpNum, SStream *O)
{
	int64_t Value = MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	// assert(isUInt<4>(Value) && "Invalid u4imm argument");
	if (Value >= 0) {
		if (Value > HEX_THRESHOLD)
			SStream_concat(O, "0x%"PRIx64, Value);
		else
			SStream_concat(O, "%"PRIu64, Value);
	} else {
		if (Value < -HEX_THRESHOLD)
			SStream_concat(O, "-0x%"PRIx64, -Value);
		else
			SStream_concat(O, "-%"PRIu64, -Value);
	}

	if (MI->csh->detail) {
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].type = SYSZ_OP_IMM;
		MI->flat_insn->detail->sysz.operands[MI->flat_insn->detail->sysz.op_count].imm = Value;
		MI->flat_insn->detail->sysz.op_count++;
	}
}